

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rebuildPage(CellArray *pCArray,int iFirst,int nCell,MemPage *pPg)

{
  uint uVar1;
  ushort *puVar2;
  char *pcVar3;
  ushort uVar4;
  int iVar5;
  ushort *__src;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  ushort *__dest;
  ushort *puVar12;
  ulong uVar13;
  ushort *puVar14;
  int local_60;
  ushort *local_50;
  
  uVar13 = (ulong)pPg->hdrOffset;
  puVar2 = (ushort *)pPg->aData;
  uVar1 = pPg->pBt->usableSize;
  puVar14 = (ushort *)((long)(int)uVar1 + (long)puVar2);
  puVar12 = (ushort *)pPg->aCellIdx;
  uVar4 = *(ushort *)((long)puVar2 + uVar13 + 5);
  uVar6 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
  uVar8 = (ulong)uVar6;
  if (uVar1 < uVar6) {
    uVar8 = 0;
  }
  pcVar3 = pPg->pBt->pPager->pTmpSpace;
  memcpy(pcVar3 + uVar8,(void *)((long)puVar2 + uVar8),(ulong)(uVar1 - (int)uVar8));
  uVar8 = 0;
  do {
    uVar11 = uVar8;
    if (5 < uVar11) break;
    uVar8 = uVar11 + 1;
  } while (pCArray->ixNx[uVar11] <= iFirst);
  iVar7 = nCell + iFirst;
  local_60 = (int)(uVar11 + 1) + -1;
  local_50 = (ushort *)pCArray->apEnd[uVar11];
  __dest = puVar14;
  do {
    __src = (ushort *)pCArray->apCell[iFirst];
    uVar8 = (ulong)pCArray->szCell[iFirst];
    if ((__src < puVar2) || (puVar14 <= __src)) {
      if ((local_50 <= __src) || ((ushort *)((long)__src + uVar8) <= local_50)) goto LAB_001595af;
      uVar9 = 0x111d3;
LAB_001595e2:
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar9,
                  "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
      iVar5 = 1;
    }
    else {
      if (puVar14 < (ushort *)((long)__src + uVar8)) {
        uVar9 = 0x111ce;
        goto LAB_001595e2;
      }
      __src = (ushort *)((long)__src + ((long)pcVar3 - (long)puVar2));
LAB_001595af:
      __dest = (ushort *)((long)__dest - uVar8);
      uVar4 = (short)__dest - (short)puVar2;
      *puVar12 = uVar4 * 0x100 | uVar4 >> 8;
      puVar12 = puVar12 + 1;
      if (__dest < puVar12) {
        uVar9 = 0x111d9;
        goto LAB_001595e2;
      }
      memcpy(__dest,__src,uVar8);
      iFirst = iFirst + 1;
      iVar5 = 6;
      if (iFirst < iVar7) {
        lVar10 = (long)local_60;
        iVar5 = 0;
        if (pCArray->ixNx[lVar10] <= iFirst) {
          local_60 = local_60 + 1;
          local_50 = (ushort *)pCArray->apEnd[lVar10 + 1];
        }
      }
    }
    if (iVar5 != 0) {
      if (iVar5 == 6) {
        pPg->nCell = (u16)nCell;
        iVar7 = 0;
        pPg->nOverflow = '\0';
        *(undefined2 *)((long)puVar2 + uVar13 + 1) = 0;
        *(undefined1 *)((long)puVar2 + uVar13 + 3) = *(undefined1 *)((long)&pPg->nCell + 1);
        *(char *)((long)puVar2 + uVar13 + 4) = (char)pPg->nCell;
        *(char *)((long)puVar2 + uVar13 + 5) = (char)((ulong)((long)__dest - (long)puVar2) >> 8);
        *(char *)((long)puVar2 + uVar13 + 6) = (char)((long)__dest - (long)puVar2);
        *(undefined1 *)((long)puVar2 + uVar13 + 7) = 0;
      }
      else {
        iVar7 = 0xb;
      }
      return iVar7;
    }
  } while( true );
}

Assistant:

static int rebuildPage(
  CellArray *pCArray,             /* Content to be added to page pPg */
  int iFirst,                     /* First cell in pCArray to use */
  int nCell,                      /* Final number of cells on page */
  MemPage *pPg                    /* The page to be reconstructed */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i = iFirst;                 /* Which cell to copy from pCArray*/
  u32 j;                          /* Start of cell content area */
  int iEnd = i+nCell;             /* Loop terminator */
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pSrcEnd;                    /* Current pCArray->apEnd[k] value */

  assert( i<iEnd );
  j = get2byte(&aData[hdr+5]);
  if( NEVER(j>(u32)usableSize) ){ j = 0; }
  memcpy(&pTmp[j], &aData[j], usableSize - j);

  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pSrcEnd = pCArray->apEnd[k];

  pData = pEnd;
  while( 1/*exit by break*/ ){
    u8 *pCell = pCArray->apCell[i];
    u16 sz = pCArray->szCell[i];
    assert( sz>0 );
    if( SQLITE_WITHIN(pCell,aData,pEnd) ){
      if( ((uptr)(pCell+sz))>(uptr)pEnd ) return SQLITE_CORRUPT_BKPT;
      pCell = &pTmp[pCell - aData];
    }else if( (uptr)(pCell+sz)>(uptr)pSrcEnd
           && (uptr)(pCell)<(uptr)pSrcEnd
    ){
      return SQLITE_CORRUPT_BKPT;
    }

    pData -= sz;
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    if( pData < pCellptr ) return SQLITE_CORRUPT_BKPT;
    memcpy(pData, pCell, sz);
    assert( sz==pPg->xCellSize(pPg, pCell) || CORRUPT_DB );
    testcase( sz!=pPg->xCellSize(pPg,pCell) );
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pSrcEnd = pCArray->apEnd[k];
    }
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
  return SQLITE_OK;
}